

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitap_iterator.hpp
# Opt level: O3

void __thiscall
burst::
bitap_iterator<burst::algorithm::bitap<int,_std::bitset<32UL>,_std::map<int,_std::bitset<32UL>,_std::less<int>,_std::allocator<std::pair<const_int,_std::bitset<32UL>_>_>_>_>,_std::forward_list<int,_std::allocator<int>_>_>
::bitap_iterator(bitap_iterator<burst::algorithm::bitap<int,_std::bitset<32UL>,_std::map<int,_std::bitset<32UL>,_std::less<int>,_std::allocator<std::pair<const_int,_std::bitset<32UL>_>_>_>_>,_std::forward_list<int,_std::allocator<int>_>_>
                 *this,searcher_type *bitap,text_range_type *text)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  _Fwd_list_const_iterator<int> first;
  _Fwd_list_const_iterator<int> corpus_current;
  iterator_range_base<std::_Fwd_list_const_iterator<int>,_boost::iterators::incrementable_traversal_tag>
  iVar2;
  
  (this->m_bitap).m_bitmask_table.
  super___shared_ptr<const_burst::algorithm::detail::element_position_bitmask_table<std::map<int,_std::bitset<32UL>,_std::less<int>,_std::allocator<std::pair<const_int,_std::bitset<32UL>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (bitap->m_bitmask_table).
            super___shared_ptr<const_burst::algorithm::detail::element_position_bitmask_table<std::map<int,_std::bitset<32UL>,_std::less<int>,_std::allocator<std::pair<const_int,_std::bitset<32UL>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr;
  p_Var1 = (bitap->m_bitmask_table).
           super___shared_ptr<const_burst::algorithm::detail::element_position_bitmask_table<std::map<int,_std::bitset<32UL>,_std::less<int>,_std::allocator<std::pair<const_int,_std::bitset<32UL>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  (this->m_bitap).m_bitmask_table.
  super___shared_ptr<const_burst::algorithm::detail::element_position_bitmask_table<std::map<int,_std::bitset<32UL>,_std::less<int>,_std::allocator<std::pair<const_int,_std::bitset<32UL>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  (this->m_hint).super__Base_bitset<1UL>._M_w = 0;
  first._M_node = (text->super__Fwd_list_base<int,_std::allocator<int>_>)._M_impl._M_head._M_next;
  corpus_current =
       algorithm::
       bitap<int,std::bitset<32ul>,std::map<int,std::bitset<32ul>,std::less<int>,std::allocator<std::pair<int_const,std::bitset<32ul>>>>>
       ::dummy_search<std::_Fwd_list_const_iterator<int>>
                 ((bitap<int,std::bitset<32ul>,std::map<int,std::bitset<32ul>,std::less<int>,std::allocator<std::pair<int_const,std::bitset<32ul>>>>>
                   *)this,first,(_Fwd_list_const_iterator<int>)0x0,&this->m_hint);
  iVar2 = (iterator_range_base<std::_Fwd_list_const_iterator<int>,_boost::iterators::incrementable_traversal_tag>
           )algorithm::
            bitap<int,std::bitset<32ul>,std::map<int,std::bitset<32ul>,std::less<int>,std::allocator<std::pair<int_const,std::bitset<32ul>>>>>
            ::active_search<std::_Fwd_list_const_iterator<int>>
                      ((bitap<int,std::bitset<32ul>,std::map<int,std::bitset<32ul>,std::less<int>,std::allocator<std::pair<int_const,std::bitset<32ul>>>>>
                        *)this,first,corpus_current,(_Fwd_list_const_iterator<int>)0x0,&this->m_hint
                      );
  (this->m_match).
  super_iterator_range_base<std::_Fwd_list_const_iterator<int>,_boost::iterators::incrementable_traversal_tag>
       = iVar2;
  (this->m_text_end)._M_node = (_Fwd_list_node_base *)0x0;
  return;
}

Assistant:

bitap_iterator (searcher_type bitap, const text_range_type & text):
            m_bitap(std::move(bitap)),
            m_hint(0b0),
            m_match(m_bitap.find_first(text.begin(), text.end(), m_hint)),
            m_text_end(text.end())
        {
        }